

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::setPlotVariables(PeleLM *this)

{
  long lVar1;
  bool bVar2;
  Long LVar3;
  Print *this_00;
  ostream *x;
  const_iterator end;
  const_iterator li;
  string name;
  long i;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5c8;
  Print *in_stack_fffffffffffff5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5d8;
  ostream *in_stack_fffffffffffff5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined7 in_stack_fffffffffffff618;
  undefined1 in_stack_fffffffffffff61f;
  Print *in_stack_fffffffffffff640;
  AmrLevel *in_stack_fffffffffffff6c0;
  _Self local_210;
  _Self local_208 [50];
  string local_78 [32];
  string local_58 [32];
  long local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20;
  
  amrex::AmrLevel::setPlotVariables(in_stack_fffffffffffff6c0);
  __rhs = &local_20;
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x52dfde);
  pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
            ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x52dfe8);
  local_38 = 0;
  while( true ) {
    lVar1 = local_38;
    LVar3 = amrex::
            Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x52e010);
    if (LVar3 <= lVar1) break;
    amrex::
    Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff5d0,(size_type)in_stack_fffffffffffff5c8);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),__rhs);
    std::operator+(in_stack_fffffffffffff5d8,(char *)in_stack_fffffffffffff5d0);
    std::__cxx11::string::~string(local_78);
    amrex::Amr::deleteStatePlotVar((string *)0x52e087);
    std::__cxx11::string::~string(local_58);
    local_38 = local_38 + 1;
  }
  if (NavierStokesBase::verbose != 0) {
    this_00 = (Print *)amrex::OutStream();
    amrex::Print::Print(this_00,in_stack_fffffffffffff5f8);
    amrex::Print::operator<<(in_stack_fffffffffffff5d0,(char (*) [19])in_stack_fffffffffffff5c8);
    amrex::Print::~Print(in_stack_fffffffffffff640);
    amrex::Amr::statePlotVars_abi_cxx11_();
    local_208[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff5c8);
    amrex::Amr::statePlotVars_abi_cxx11_();
    local_210._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff5c8);
    while( true ) {
      bVar2 = std::operator!=(local_208,&local_210);
      if (!bVar2) break;
      in_stack_fffffffffffff5f8 = amrex::OutStream();
      amrex::Print::Print(this_00,in_stack_fffffffffffff5f8);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff5d0);
      amrex::Print::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      amrex::Print::operator<<(in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8);
      amrex::Print::~Print(in_stack_fffffffffffff640);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_208);
    }
    amrex::OutStream();
    amrex::Print::Print(this_00,in_stack_fffffffffffff5f8);
    amrex::Print::operator<<(in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8);
    amrex::Print::~Print(in_stack_fffffffffffff640);
    amrex::OutStream();
    amrex::Print::Print(this_00,in_stack_fffffffffffff5f8);
    amrex::Print::operator<<(in_stack_fffffffffffff5d0,(char (*) [20])in_stack_fffffffffffff5c8);
    amrex::Print::~Print(in_stack_fffffffffffff640);
    amrex::Amr::derivePlotVars_abi_cxx11_();
    local_208[0]._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff5c8);
    amrex::Amr::derivePlotVars_abi_cxx11_();
    local_210._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff5c8);
    while( true ) {
      bVar2 = std::operator!=(local_208,&local_210);
      if (!bVar2) break;
      amrex::OutStream();
      amrex::Print::Print(this_00,in_stack_fffffffffffff5f8);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)in_stack_fffffffffffff5d0);
      in_stack_fffffffffffff5d0 =
           amrex::Print::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      amrex::Print::operator<<(in_stack_fffffffffffff5d0,(char *)in_stack_fffffffffffff5c8);
      amrex::Print::~Print(in_stack_fffffffffffff640);
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_208);
    }
    x = amrex::OutStream();
    amrex::Print::Print(this_00,in_stack_fffffffffffff5f8);
    amrex::Print::operator<<(in_stack_fffffffffffff5d0,(char *)x);
    amrex::Print::~Print(in_stack_fffffffffffff640);
  }
  amrex::
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x52e4c9);
  return;
}

Assistant:

void
PeleLM::setPlotVariables ()
{
  AmrLevel::setPlotVariables();

  Vector<std::string> names;
  pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);


// Here we specify to not plot all the rho.Y from the state variables
// because it takes a lot of space in memory and disk usage
// To plot rho.Y, we pass into a derive function (see PeleLM_setup.cpp)
// and it can be activated with "amr.derive_plot_vars=rhoY" in the input file
  for (long int i = 0; i < names.size(); i++)
  {
    const std::string name = "rho.Y("+names[i]+")";
    parent->deleteStatePlotVar(name);
  }

  if (verbose)
  {
    amrex::Print() << "\nState Plot Vars: ";

    std::list<std::string>::const_iterator li =
      parent->statePlotVars().begin(), end = parent->statePlotVars().end();

    for ( ; li != end; ++li)
      amrex::Print() << *li << ' ';
    amrex::Print() << '\n';

    amrex::Print() << "\nDerive Plot Vars: ";

    li  = parent->derivePlotVars().begin();
    end = parent->derivePlotVars().end();

    for ( ; li != end; ++li)
      amrex::Print() << *li << ' ';
    amrex::Print() << '\n';
  }
}